

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE
qpdf_read_memory(qpdf_data qpdf,char *description,char *buffer,unsigned_long_long size,
                char *password)

{
  _func_void__qpdf_data_ptr *local_60;
  function<void_(_qpdf_data_*)> local_58;
  int local_34;
  char *pcStack_30;
  QPDF_ERROR_CODE status;
  char *password_local;
  unsigned_long_long size_local;
  char *buffer_local;
  char *description_local;
  qpdf_data qpdf_local;
  
  local_34 = 0;
  qpdf->filename = description;
  qpdf->buffer = buffer;
  qpdf->size = size;
  qpdf->password = password;
  local_60 = call_read_memory;
  pcStack_30 = password;
  password_local = (char *)size;
  size_local = (unsigned_long_long)buffer;
  buffer_local = description;
  description_local = (char *)qpdf;
  std::function<void(_qpdf_data*)>::function<void(*)(_qpdf_data*),void>
            ((function<void(_qpdf_data*)> *)&local_58,&local_60);
  local_34 = trap_errors(qpdf,&local_58);
  std::function<void_(_qpdf_data_*)>::~function(&local_58);
  QTC::TC("qpdf","qpdf-c called qpdf_read_memory",local_34);
  return local_34;
}

Assistant:

QPDF_ERROR_CODE
qpdf_read_memory(
    qpdf_data qpdf,
    char const* description,
    char const* buffer,
    unsigned long long size,
    char const* password)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    qpdf->filename = description;
    qpdf->buffer = buffer;
    qpdf->size = size;
    qpdf->password = password;
    status = trap_errors(qpdf, &call_read_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_read_memory", status);
    return status;
}